

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

type __thiscall
c4::yml::Tree::to_arena<c4::fmt::base64_wrapper_<char_const>>
          (Tree *this,base64_wrapper_<const_char> *a)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  code *pcVar4;
  size_t sVar5;
  bool bVar6;
  size_t more;
  substr sVar7;
  type tVar8;
  basic_substring<char> local_50;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  uVar1 = this->m_arena_pos;
  if ((this->m_arena).len < uVar1) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar4 = (code *)swi(3);
        tVar8 = (type)(*pcVar4)();
        return tVar8;
      }
    }
    handle_error(0x200e84,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            (&local_50,(this->m_arena).str + uVar1,(this->m_arena).len - uVar1);
  sVar5 = local_50.len;
  uVar2 = *(undefined8 *)a;
  uVar3 = *(undefined8 *)(a + 8);
  more = base64_encode(local_50.str,local_50.len,uVar2,uVar3);
  if (sVar5 < more) {
    sVar7 = _grow_arena(this,more);
    more = base64_encode(sVar7.str,sVar7.len,uVar2,uVar3);
    if (sVar7.len < more) {
      if ((s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar4 = (code *)swi(3);
          tVar8 = (type)(*pcVar4)();
          return tVar8;
        }
      }
      local_50.str = (char *)0x0;
      local_50.len = 0x4d80;
      local_40 = 0;
      pcStack_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_30 = 0x65;
      (*(code *)PTR_error_impl_00243548)
                ("check failed: num <= rem.len",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
  }
  sVar7 = _request_span(this,more);
  tVar8.str = sVar7.str;
  tVar8.len = sVar7.len;
  return tVar8;
}

Assistant:

typename std::enable_if<!std::is_floating_point<T>::value, csubstr>::type
    to_arena(T const& C4_RESTRICT a)
    {
        substr rem(m_arena.sub(m_arena_pos));
        size_t num = to_chars(rem, a);
        if(num > rem.len)
        {
            rem = _grow_arena(num);
            num = to_chars(rem, a);
            RYML_ASSERT(num <= rem.len);
        }
        rem = _request_span(num);
        return rem;
    }